

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.C
# Opt level: O2

bool __thiscall Search::excludeFileByContent(Search *this,string *path)

{
  FILE *f_00;
  bool bVar1;
  FILE *pFVar2;
  char *pcVar3;
  size_t sVar4;
  int *piVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  string local_488;
  char *local_468;
  undefined8 local_460;
  undefined1 local_458;
  undefined1 local_454;
  undefined2 local_450;
  undefined1 local_44e;
  allocator local_448 [8];
  char acStack_440 [23];
  char cStack_429;
  char buf [1024];
  
  std::__cxx11::string::string((string *)buf,(path->_M_dataplus)._M_p,(allocator *)&local_468);
  std::__cxx11::string::string((string *)&local_488,"r",local_448);
  pFVar2 = Utils::fopen(buf,(char *)&local_488);
  f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
  super__Tuple_impl<1UL,_void_(*)(_IO_FILE_*)>.super__Head_base<1UL,_void_(*)(_IO_FILE_*),_false>.
  _M_head_impl = (_Head_base<1UL,_void_(*)(_IO_FILE_*),_false>)fclose;
  f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (_IO_FILE *)pFVar2;
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)buf);
  f_00 = _stderr;
  if (pFVar2 == (FILE *)0x0) {
    local_468 = "ERROR:";
    local_460 = 0xff000000000001;
    local_458 = 0;
    local_454 = 0;
    local_450 = 1;
    local_44e = 0;
    piVar5 = __errno_location();
    Utils::strerror_abi_cxx11_((Utils *)local_448,*piVar5);
    buf._16_8_ = (path->_M_dataplus)._M_p;
    buf._24_8_ = path->_M_string_length;
    buf._8_8_ = ::fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
                format_custom_arg<fmt::v10::detail::styled_arg<char[7]>,fmt::v10::formatter<fmt::v10::detail::styled_arg<char[7]>,char,void>>
    ;
    buf[0x20] = (char)local_448[0];
    buf[0x21] = (char)local_448[1];
    buf[0x22] = (char)local_448[2];
    buf[0x23] = (char)local_448[3];
    buf[0x24] = (char)local_448[4];
    buf[0x25] = (char)local_448[5];
    buf[0x26] = (char)local_448[6];
    buf[0x27] = (char)local_448[7];
    buf[0x28] = acStack_440[0];
    buf[0x29] = acStack_440[1];
    buf[0x2a] = acStack_440[2];
    buf[0x2b] = acStack_440[3];
    buf[0x2c] = acStack_440[4];
    buf[0x2d] = acStack_440[5];
    buf[0x2e] = acStack_440[6];
    buf[0x2f] = acStack_440[7];
    fmt_00.size_ = 0xddf;
    fmt_00.data_ = (char *)0x1e;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)buf;
    buf._0_8_ = (allocator *)&local_468;
    ::fmt::v10::vformat_abi_cxx11_(&local_488,(v10 *)"{} Failed to open file {} : {}",fmt_00,args);
    buf._0_8_ = local_488._M_dataplus._M_p;
    buf[8] = (undefined1)local_488._M_string_length;
    buf[9] = local_488._M_string_length._1_1_;
    buf[10] = local_488._M_string_length._2_1_;
    buf[0xb] = local_488._M_string_length._3_1_;
    buf[0xc] = local_488._M_string_length._4_1_;
    buf[0xd] = local_488._M_string_length._5_1_;
    buf[0xe] = local_488._M_string_length._6_1_;
    buf[0xf] = local_488._M_string_length._7_1_;
    fmt.size_ = 3;
    fmt.data_ = "{}\n";
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)buf;
    args_00.desc_ = 0xd;
    ::fmt::v10::vprint(f_00,fmt,args_00);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)local_448);
    bVar1 = false;
  }
  else {
    bVar1 = false;
    while (bVar1 == false) {
      pcVar3 = fgets(buf,0x400,
                     (FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                             super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                             super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      if (pcVar3 == (char *)0x0) break;
      sVar4 = strlen(buf);
      while ((sVar4 != 0 && ((buf[sVar4 - 1] == '\r' || (buf[sVar4 - 1] == '\n'))))) {
        buf[sVar4 - 1] = '\0';
        sVar4 = sVar4 - 1;
      }
      std::__cxx11::string::string((string *)&local_488,buf,(allocator *)&local_468);
      bVar1 = Filter::excludeContent(&this->_filter,&local_488);
      std::__cxx11::string::~string((string *)&local_488);
    }
  }
  std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr(&f);
  return bVar1;
}

Assistant:

bool Search::excludeFileByContent(std::string const & path) const
{
    bool rval = false;
    std::unique_ptr<FILE, decltype(&fclose)> f(Utils::fopen(path.c_str(), "r"), &fclose);
    if (!f) {
        fmt::println(stderr, "{} Failed to open file {} : {}",
                    fmt::styled("ERROR:", fmt::fg(fmt::color::red)),
                    path,
                    Utils::strerror(errno));
        return rval;
    }

    char buf[1024];
    while (!rval && fgets(buf, sizeof(buf), f.get()) != nullptr) {
        // Remove trailing CR and LF characters
        size_t sz = strlen(buf);
        while (sz > 0 && (buf[sz - 1] == '\n' || buf[sz - 1] == '\r')) {
            buf[--sz] = '\0';
        }
        rval = _filter.excludeContent(buf);
    }
    return rval;
}